

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_getSolution(void *highs,double *col_value,double *col_dual,double *row_value,
                          double *row_dual)

{
  HighsSolution *pHVar1;
  size_type sVar2;
  const_reference pvVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  Highs *in_RDI;
  long in_R8;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  HighsSolution *solution;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pHVar1 = Highs::getSolution(in_RDI);
  if (in_RSI != 0) {
    for (local_38 = 0;
        sVar2 = std::vector<double,_std::allocator<double>_>::size(&pHVar1->col_value),
        local_38 < sVar2; local_38 = local_38 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&pHVar1->col_value,local_38)
      ;
      *(value_type *)(in_RSI + local_38 * 8) = *pvVar3;
    }
  }
  if (in_RDX != 0) {
    for (local_40 = 0; sVar2 = std::vector<double,_std::allocator<double>_>::size(&pHVar1->col_dual)
        , local_40 < sVar2; local_40 = local_40 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&pHVar1->col_dual,local_40);
      *(value_type *)(in_RDX + local_40 * 8) = *pvVar3;
    }
  }
  if (in_RCX != 0) {
    for (local_48 = 0;
        sVar2 = std::vector<double,_std::allocator<double>_>::size(&pHVar1->row_value),
        local_48 < sVar2; local_48 = local_48 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&pHVar1->row_value,local_48)
      ;
      *(value_type *)(in_RCX + local_48 * 8) = *pvVar3;
    }
  }
  if (in_R8 != 0) {
    for (local_50 = 0; sVar2 = std::vector<double,_std::allocator<double>_>::size(&pHVar1->row_dual)
        , local_50 < sVar2; local_50 = local_50 + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](&pHVar1->row_dual,local_50);
      *(value_type *)(in_R8 + local_50 * 8) = *pvVar3;
    }
  }
  return 0;
}

Assistant:

HighsInt Highs_getSolution(const void* highs, double* col_value,
                           double* col_dual, double* row_value,
                           double* row_dual) {
  const HighsSolution& solution = ((Highs*)highs)->getSolution();

  if (col_value != nullptr) {
    for (size_t i = 0; i < solution.col_value.size(); i++) {
      col_value[i] = solution.col_value[i];
    }
  }

  if (col_dual != nullptr) {
    for (size_t i = 0; i < solution.col_dual.size(); i++) {
      col_dual[i] = solution.col_dual[i];
    }
  }

  if (row_value != nullptr) {
    for (size_t i = 0; i < solution.row_value.size(); i++) {
      row_value[i] = solution.row_value[i];
    }
  }

  if (row_dual != nullptr) {
    for (size_t i = 0; i < solution.row_dual.size(); i++) {
      row_dual[i] = solution.row_dual[i];
    }
  }
  return kHighsStatusOk;
}